

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  ShaderReturnCase *pSVar2;
  char *pcVar3;
  char *pcVar4;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  string description_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string name_2;
  int isFragment_2;
  int returnMode_2;
  int isDynamicLoop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  undefined1 local_188 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string name_1;
  int isFragment_1;
  int returnMode_1;
  int inFunc;
  undefined1 local_b0 [8];
  string description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  ReturnMode local_20;
  int isFragment;
  int returnMode;
  ShaderReturnTests *this_local;
  
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"single_return_vertex",
             "Single return statement in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"single_return_fragment",
             "Single return statement in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  for (local_20 = RETURNMODE_ALWAYS; (int)local_20 < 3; local_20 = local_20 + RETURNMODE_NEVER) {
    for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
        name.field_2._12_4_ = name.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"conditional_return_",
                 (allocator<char> *)(description.field_2._M_local_buf + 0xf));
      pcVar3 = getReturnModeName(local_20);
      std::operator+(&local_68,&local_88,pcVar3);
      pcVar3 = "_vertex";
      if (name.field_2._12_4_ != 0) {
        pcVar3 = "_fragment";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     &local_68,pcVar3);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
      pcVar3 = getReturnModeDesc(local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&inFunc,pcVar3,(allocator<char> *)((long)&returnMode_1 + 3));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inFunc,
                     " in function");
      std::__cxx11::string::~string((string *)&inFunc);
      std::allocator<char>::~allocator((allocator<char> *)((long)&returnMode_1 + 3));
      pCVar1 = (this->super_TestCaseGroup).m_context;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      pSVar2 = makeConditionalReturnInFuncCase
                         (pCVar1,pcVar3,pcVar4,local_20,name.field_2._12_4_ == 0);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"double_return_vertex",
             "Unconditional double return in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"double_return_fragment",
             "Unconditional double return in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"last_statement_in_main_vertex",
             "Return as a final statement in main()",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"last_statement_in_main_fragment",
             "Return as a final statement in main()",false,
             "varying mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_FragColor = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  for (isFragment_1 = 0; isFragment_1 < 2; isFragment_1 = isFragment_1 + 1) {
    for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 3;
        name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
      for (name_1.field_2._8_4_ = 0; (int)name_1.field_2._8_4_ < 2;
          name_1.field_2._8_4_ = name_1.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"output_write_",
                   (allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        pcVar3 = "";
        if (isFragment_1 != 0) {
          pcVar3 = "in_func_";
        }
        std::operator+(&local_140,&local_160,pcVar3);
        pcVar3 = getReturnModeName(name_1.field_2._12_4_);
        std::operator+(&local_120,&local_140,pcVar3);
        pcVar3 = "_vertex";
        if (name_1.field_2._8_4_ != 0) {
          pcVar3 = "_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,&local_120,pcVar3);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        pcVar3 = getReturnModeDesc(name_1.field_2._12_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&isDynamicLoop,pcVar3,(allocator<char> *)((long)&returnMode_2 + 3));
        pcVar3 = " in main()";
        if (isFragment_1 != 0) {
          pcVar3 = " in user-defined function";
        }
        std::operator+(&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &isDynamicLoop,pcVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_188,&local_1a8," between output writes");
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&isDynamicLoop);
        std::allocator<char>::~allocator((allocator<char> *)((long)&returnMode_2 + 3));
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pSVar2 = makeOutputWriteReturnCase
                           (pCVar1,pcVar3,pcVar4,isFragment_1 != 0,name_1.field_2._12_4_,
                            name_1.field_2._8_4_ == 0);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
        std::__cxx11::string::~string((string *)local_188);
        std::__cxx11::string::~string((string *)local_100);
      }
    }
  }
  for (isFragment_2 = 0; isFragment_2 < 2; isFragment_2 = isFragment_2 + 1) {
    for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 3;
        name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
      for (name_2.field_2._8_4_ = 0; (int)name_2.field_2._8_4_ < 2;
          name_2.field_2._8_4_ = name_2.field_2._8_4_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"return_in_",
                   (allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
        pcVar3 = "static";
        if (isFragment_2 != 0) {
          pcVar3 = "dynamic";
        }
        std::operator+(&local_258,&local_278,pcVar3);
        std::operator+(&local_238,&local_258,"_loop_");
        pcVar3 = getReturnModeName(name_2.field_2._12_4_);
        std::operator+(&local_218,&local_238,pcVar3);
        pcVar3 = "_vertex";
        if (name_2.field_2._8_4_ != 0) {
          pcVar3 = "_fragment";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,&local_218,pcVar3);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(description_1.field_2._M_local_buf + 0xf));
        pcVar3 = getReturnModeDesc(name_2.field_2._12_4_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar3,&local_2c1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a0,&local_2c0," in loop");
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        pCVar1 = (this->super_TestCaseGroup).m_context;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        pSVar2 = makeReturnInLoopCase
                           (pCVar1,pcVar3,pcVar4,isFragment_2 != 0,name_2.field_2._12_4_,
                            name_2.field_2._8_4_ == 0);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
        std::__cxx11::string::~string((string *)local_2a0);
        std::__cxx11::string::~string((string *)local_1f8);
      }
    }
  }
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"return_in_infinite_loop_vertex",
             "Return in infinite loop",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  pSVar2 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar2,(this->super_TestCaseGroup).m_context,"return_in_infinite_loop_fragment",
             "Return in infinite loop",false,
             "varying mediump vec4 v_coords;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_FragColor = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"varying mediump vec4 v_coords;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
}